

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

AggregateFunction *
duckdb::
ReservoirQuantileListAggregate<duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::list_entry_t,duckdb::ReservoirQuantileListOperation<duckdb::hugeint_t>>
          (LogicalType *input_type,LogicalType *child_type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  aggregate_finalize_t in_RDX;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  aggregate_destructor_t unaff_retaddr;
  aggregate_statistics_t in_stack_00000008;
  aggregate_window_t in_stack_00000010;
  aggregate_serialize_t in_stack_00000018;
  aggregate_deserialize_t in_stack_00000020;
  LogicalType result_type;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  size_type in_stack_fffffffffffffee0;
  LogicalType *local_b0;
  aggregate_update_t in_stack_ffffffffffffff78;
  aggregate_initialize_t in_stack_ffffffffffffff80;
  LogicalType *this;
  LogicalType *in_stack_ffffffffffffff90;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff98;
  AggregateFunction *in_stack_ffffffffffffffa0;
  undefined1 *local_58;
  undefined8 local_50;
  LogicalType local_30 [16];
  aggregate_combine_t in_stack_ffffffffffffffe0;
  AggregateFunction *bind;
  
  bind = in_RDI;
  duckdb::LogicalType::LIST(local_30);
  this = (LogicalType *)&stack0xffffffffffffff90;
  duckdb::LogicalType::LogicalType(this,in_RSI);
  local_58 = &stack0xffffffffffffff90;
  local_50 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x9c5c57);
  iVar1._M_len = in_stack_fffffffffffffee0;
  iVar1._M_array = in_stack_fffffffffffffed8;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  AggregateFunction::AggregateFunction
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (aggregate_size_t)this,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffffe0,in_RDX,(aggregate_simple_update_t)in_RSI,
             (bind_aggregate_function_t)bind,unaff_retaddr,in_stack_00000008,in_stack_00000010,
             in_stack_00000018,in_stack_00000020);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x9c5d1d);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x9c5d2a);
  local_b0 = (LogicalType *)&local_58;
  do {
    local_b0 = local_b0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_b0);
  } while (local_b0 != (LogicalType *)&stack0xffffffffffffff90);
  duckdb::LogicalType::~LogicalType(local_30);
  return in_RDI;
}

Assistant:

static AggregateFunction ReservoirQuantileListAggregate(const LogicalType &input_type, const LogicalType &child_type) {
	LogicalType result_type = LogicalType::LIST(child_type);
	return AggregateFunction(
	    {input_type}, result_type, AggregateFunction::StateSize<STATE>, AggregateFunction::StateInitialize<STATE, OP>,
	    AggregateFunction::UnaryScatterUpdate<STATE, INPUT_TYPE, OP>, AggregateFunction::StateCombine<STATE, OP>,
	    AggregateFunction::StateFinalize<STATE, RESULT_TYPE, OP>, AggregateFunction::UnaryUpdate<STATE, INPUT_TYPE, OP>,
	    nullptr, AggregateFunction::StateDestroy<STATE, OP>);
}